

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O1

void readCore(string *fn,uint64_t *headerTimeAccum,uint64_t *imgDataTimeAccum,
             uint64_t *closeTimeAccum,uint64_t *pixCount)

{
  int iVar1;
  long lVar2;
  Task *pTVar3;
  Task *this;
  long lVar4;
  runtime_error *this_00;
  ostream *poVar5;
  logic_error *this_01;
  code *pcVar6;
  undefined *puVar7;
  pointer puVar8;
  int32_t linesread;
  int32_t ccount;
  uint64_t sizePerChunk;
  exr_lineorder_t lo;
  exr_storage_t stortype;
  exr_context_t c;
  exr_attr_box2i_t dw;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rawBuf;
  exr_context_initializer_t cinit;
  int local_128;
  int local_124;
  TaskGroup local_120 [8];
  long local_118;
  int local_110;
  uint local_10c;
  long local_108;
  undefined8 local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  long local_c8;
  uint64_t *local_c0;
  uint64_t *local_b8;
  uint64_t *local_b0;
  long local_a8;
  uint64_t *local_a0;
  undefined8 local_98;
  code *pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_38 = 0;
  local_98 = 0x68;
  uStack_40 = 0xbf800000fffffffe;
  pcStack_90 = error_handler_new;
  local_a0 = pixCount;
  local_a8 = std::chrono::_V2::steady_clock::now();
  iVar1 = exr_start_read(&local_100,(fn->_M_dataplus)._M_p,&local_98);
  if (iVar1 != 0) {
    return;
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  iVar1 = exr_get_data_window(local_100,0,&local_f8);
  if (iVar1 == 0) {
    local_108 = (long)local_f0 - (long)local_f8;
    local_c8 = lVar2;
    local_c0 = headerTimeAccum;
    local_b8 = imgDataTimeAccum;
    local_b0 = closeTimeAccum;
    if (local_108 < 0) {
      lVar2 = 0;
LAB_00104d44:
      *local_a0 = *local_a0 + lVar2;
      lVar2 = std::chrono::_V2::steady_clock::now();
      exr_finish(&local_100);
      lVar4 = std::chrono::_V2::steady_clock::now();
      *local_c0 = *local_c0 + (local_c8 - local_a8);
      *local_b8 = *local_b8 + (lVar2 - local_c8);
      *local_b0 = *local_b0 + (lVar4 - lVar2);
      return;
    }
    iVar1 = exr_get_storage(local_100,0,&local_10c);
    if (iVar1 == 0) {
      if ((local_10c & 0xfffffffd) == 1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this_00,"Tiled performance read test NYI");
      }
      else {
        iVar1 = exr_get_lineorder(local_100,0,&local_110);
        if (iVar1 == 0) {
          if (local_110 != 1) {
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_118 = 0;
            local_124 = 0;
            local_128 = 0;
            iVar1 = exr_get_chunk_unpacked_size(local_100,0);
            if (iVar1 == 0) {
              iVar1 = exr_get_chunk_count(local_100,0,&local_124);
              if (iVar1 == 0) {
                iVar1 = exr_get_scanlines_per_chunk(local_100,0,&local_128);
                if (iVar1 == 0) {
                  if ((0 < (long)local_124) && (1 < local_118 + 1U)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_e8,local_118 * local_124);
                    puVar8 = local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    IlmThread_3_2::TaskGroup::TaskGroup(local_120);
                    pTVar3 = (Task *)IlmThread_3_2::ThreadPool::globalThreadPool();
                    if (local_ec < local_f4) {
                      lVar2 = 0;
                    }
                    else {
                      local_108 = local_108 + 1;
                      lVar2 = 0;
                      iVar1 = local_f4;
                      do {
                        this = (Task *)operator_new(0x28);
                        IlmThread_3_2::Task::Task(this,local_120);
                        *(undefined ***)this = &PTR__Task_00107d00;
                        *(undefined8 *)(this + 0x10) = local_100;
                        *(int *)(this + 0x18) = iVar1;
                        *(pointer *)(this + 0x20) = puVar8;
                        IlmThread_3_2::ThreadPool::addTask(pTVar3);
                        puVar8 = puVar8 + local_118;
                        iVar1 = iVar1 + local_128;
                        lVar2 = lVar2 + local_128 * local_108;
                      } while (iVar1 <= local_ec);
                    }
                    IlmThread_3_2::TaskGroup::~TaskGroup(local_120);
                    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_e8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_e8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    goto LAB_00104d44;
                  }
                  exr_print_context_info(local_100,1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"sizePerChunk: ",0xe);
                  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"chunk_count: ",0xd);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_124);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"linesperchunk: ",0xf);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_128);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(this_01,"invalid chunk information");
                }
                else {
                  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error
                            (this_01,"Unable to get scanlines per chunk for part 0");
                }
              }
              else {
                this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(this_01,"Unable to get chunk count for part 0");
              }
            }
            else {
              this_01 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_01,"Unable to get chunk unpacked size for part 0");
            }
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"decreasing y not yet finished");
          pcVar6 = std::runtime_error::~runtime_error;
          puVar7 = &std::runtime_error::typeinfo;
          goto LAB_00104e2d;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this_00,"Unable to query line order from part")
        ;
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error((logic_error *)this_00,"Unable to query storage type from part")
      ;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error((logic_error *)this_00,"Unable to query data window from part");
  }
  pcVar6 = std::logic_error::~logic_error;
  puVar7 = &std::logic_error::typeinfo;
LAB_00104e2d:
  __cxa_throw(this_00,puVar7,pcVar6);
}

Assistant:

static void
readCore (
    const std::string& fn,
    uint64_t&          headerTimeAccum,
    uint64_t&          imgDataTimeAccum,
    uint64_t&          closeTimeAccum,
    uint64_t&          pixCount)
{
    try
    {
        exr_context_t             c;
        exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

        cinit.error_handler_fn = &error_handler_new;

        auto hstart = std::chrono::steady_clock::now ();
        if (EXR_ERR_SUCCESS == exr_start_read (&c, fn.c_str (), &cinit))
        {
            auto hend = std::chrono::steady_clock::now ();
            pixCount += read_pixels_raw (c);
            auto imgtime = std::chrono::steady_clock::now ();
            exr_finish (&c);
            auto closetime = std::chrono::steady_clock::now ();
            headerTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    hend - hstart)
                    .count ();
            imgDataTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    imgtime - hend)
                    .count ();
            closeTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    closetime - imgtime)
                    .count ();
        }
    }
    catch (std::exception& e)
    {
        std::cerr << "readCore: " << e.what () << std::endl;
        throw;
    }
}